

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeText>
               (ostream *stream,long *arg)

{
  value_type vVar1;
  IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
  *this;
  long lVar2;
  ulong uVar3;
  
  this = (IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
          *)*arg;
  if ((IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
       *)arg[1] != this) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
        this = (IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
                *)(*arg + lVar2);
      }
      vVar1 = IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
              ::deref(this);
      std::ostream::operator<<(stream,vVar1);
      uVar3 = uVar3 + 1;
      this = (IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
              *)*arg;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)(arg[1] - (long)this >> 4));
  }
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const VecOfRange<T> &arg, PrintMode) {
    if(PrintMode::is_binfmt && arg.rvec.empty()) throw plotting_empty_container();
    for(size_t i=0; i<arg.rvec.size(); i++) {
        if(i && PrintMode::is_text) stream << " ";
        deref_and_print(stream, arg.rvec[i], PrintMode());
    }
}